

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

void duckdb::StringStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  uint *puVar1;
  byte bVar2;
  UnicodeType UVar3;
  ulong uVar4;
  InternalException *pIVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint *s;
  bool bVar9;
  string_t value;
  UnifiedVectorFormat vdata;
  string local_1e0;
  Vector *local_1c0;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  data_ptr_t local_1a0;
  UnifiedVectorFormat local_198;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
  local_1c0 = vector;
  Vector::ToUnifiedFormat(vector,count,&local_198);
  if (count != 0) {
    local_1a0 = local_198.data;
    uVar8 = 0;
    do {
      uVar6 = uVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)sel->sel_vector[uVar8];
      }
      if ((local_198.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_198.sel)->sel_vector[uVar6];
      }
      if ((local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
           >> (uVar6 & 0x3f) & 1) != 0)) {
        puVar1 = (uint *)(local_1a0 + uVar6 * 0x10);
        local_1b8 = *puVar1;
        uStack_1b4 = puVar1[1];
        uStack_1b0 = puVar1[2];
        uStack_1ac = puVar1[3];
        uVar6 = (ulong)local_1b8;
        s = &uStack_1b4;
        if (0xc < uVar6) {
          s = *(uint **)(puVar1 + 2);
        }
        if (((stats->stats_union).string_data.has_max_string_length == true) &&
           ((stats->stats_union).string_data.max_string_length < local_1b8)) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e0,
                     "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s"
                     ,"");
          BaseStatistics::ToString_abi_cxx11_(&local_50,stats);
          Vector::ToString_abi_cxx11_(&local_70,local_1c0,count);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar5,&local_1e0,&local_50,&local_70);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (((stats->type).id_ == VARCHAR) &&
           ((stats->stats_union).string_data.has_unicode == false)) {
          UVar3 = Utf8Proc::Analyze((char *)s,uVar6,(UnicodeInvalidReason *)0x0,(size_t *)0x0);
          if (UVar3 == INVALID) {
            pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e0,"Invalid unicode detected in vector: %s","");
            Vector::ToString_abi_cxx11_(&local_d0,local_1c0,count);
            InternalException::InternalException<std::__cxx11::string>(pIVar5,&local_1e0,&local_d0);
            __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (UVar3 == UNICODE) {
            pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e0,
                       "Statistics mismatch: string value contains unicode, but statistics says it shouldn\'t.\nStatistics: %s\nVector: %s"
                       ,"");
            BaseStatistics::ToString_abi_cxx11_(&local_90,stats);
            Vector::ToString_abi_cxx11_(&local_b0,local_1c0,count);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar5,&local_1e0,&local_90,&local_b0);
            __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        uVar4 = 8;
        if (uVar6 < 8) {
          uVar4 = uVar6;
        }
        if (uVar6 != 0) {
          lVar7 = 0;
          do {
            bVar2 = *(byte *)((long)&stats->stats_union + lVar7);
            if (*(byte *)((long)s + lVar7) < bVar2) {
              pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,
                         "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s"
                         ,"");
              BaseStatistics::ToString_abi_cxx11_(&local_f0,stats);
              Vector::ToString_abi_cxx11_(&local_110,local_1c0,count);
              InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                        (pIVar5,&local_1e0,&local_f0,&local_110);
              __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            }
          } while ((*(byte *)((long)s + lVar7) <= bVar2) &&
                  (bVar9 = uVar4 - 1 != lVar7, lVar7 = lVar7 + 1, bVar9));
          uVar6 = 0;
          do {
            bVar2 = *(byte *)((long)&stats->stats_union + uVar6 + 8);
            if (*(byte *)((long)s + uVar6) < bVar2) break;
            if (bVar2 < *(byte *)((long)s + uVar6)) {
              pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,
                         "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s"
                         ,"");
              BaseStatistics::ToString_abi_cxx11_(&local_130,stats);
              Vector::ToString_abi_cxx11_(&local_150,local_1c0,count);
              InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                        (pIVar5,&local_1e0,&local_130,&local_150);
              __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            }
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != count);
  }
  if (local_198.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void StringStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &string_data = StringStats::GetDataUnsafe(stats);

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		auto value = data[index];
		auto data = value.GetData();
		auto len = value.GetSize();
		// LCOV_EXCL_START
		if (string_data.has_max_string_length && len > string_data.max_string_length) {
			throw InternalException(
			    "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s",
			    stats.ToString(), vector.ToString(count));
		}
		if (stats.GetType().id() == LogicalTypeId::VARCHAR && !string_data.has_unicode) {
			auto unicode = Utf8Proc::Analyze(data, len);
			if (unicode == UnicodeType::UNICODE) {
				throw InternalException("Statistics mismatch: string value contains unicode, but statistics says it "
				                        "shouldn't.\nStatistics: %s\nVector: %s",
				                        stats.ToString(), vector.ToString(count));
			} else if (unicode == UnicodeType::INVALID) {
				throw InternalException("Invalid unicode detected in vector: %s", vector.ToString(count));
			}
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.min) < 0) {
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.max) > 0) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		// LCOV_EXCL_STOP
	}
}